

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManComputeOverlap2One_rec(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  cVar1 = Vec_StrEntry(vLabel,iObj);
  iVar3 = 0;
  if (cVar1 == '\0') {
    Vec_StrWriteEntry(vLabel,iObj,'\x01');
    pGVar5 = Gia_ManObj(p,iObj);
    uVar2 = (uint)*(undefined8 *)pGVar5;
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x133,
                    "int Gia_ManComputeOverlap2One_rec(Gia_Man_t *, int, Vec_Str_t *, Vec_Int_t *)")
      ;
    }
    iVar3 = Gia_ManComputeOverlap2One_rec(p,iObj - (uVar2 & 0x1fffffff),vLabel,vVisit);
    iVar4 = Gia_ManComputeOverlap2One_rec
                      (p,iObj - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff),vLabel,vVisit);
    Vec_IntPush(vVisit,iObj);
    iVar3 = iVar3 + iVar4 + 1;
  }
  return iVar3;
}

Assistant:

int Gia_ManComputeOverlap2One_rec( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int Counter;
    if ( Vec_StrEntry(vLabel, iObj) )
        return 0;
    Vec_StrWriteEntry( vLabel, iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsAnd(pObj) );
    Counter  = Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId0(pObj, iObj), vLabel, vVisit );
    Counter += Gia_ManComputeOverlap2One_rec( p, Gia_ObjFaninId1(pObj, iObj), vLabel, vVisit );
    Vec_IntPush( vVisit, iObj );
    return Counter + 1;
}